

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::next(QWizard *this)

{
  QWizardPrivate *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  int next;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (this_00->current != -1) {
    cVar1 = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1c8))();
    if (cVar1 != '\0') {
      next = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1d0))(this);
      if (next != -1) {
        bVar2 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)&this_00->history,&next);
        if (bVar2) {
          pcVar3 = "QWizard::next: Page %d already met";
        }
        else {
          bVar2 = QMap<int,_QWizardPage_*>::contains(&this_00->pageMap,&next);
          if (bVar2) {
            QWizardPrivate::switchToPage(this_00,next,Forward);
            goto LAB_004c4c5a;
          }
          pcVar3 = "QWizard::next: No such page %d";
        }
        local_28 = "default";
        local_40[0x14] = '\0';
        local_40[0x15] = '\0';
        local_40[0x16] = '\0';
        local_40[0x17] = '\0';
        local_40[0xc] = '\0';
        local_40[0xd] = '\0';
        local_40[0xe] = '\0';
        local_40[0xf] = '\0';
        local_40[0x10] = '\0';
        local_40[0x11] = '\0';
        local_40[0x12] = '\0';
        local_40[0x13] = '\0';
        local_40[4] = '\0';
        local_40[5] = '\0';
        local_40[6] = '\0';
        local_40[7] = '\0';
        local_40[8] = '\0';
        local_40[9] = '\0';
        local_40[10] = '\0';
        local_40[0xb] = '\0';
        local_40[0] = '\x02';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        QMessageLogger::warning(local_40,pcVar3,(ulong)(uint)next);
      }
    }
  }
LAB_004c4c5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::next()
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (validateCurrentPage()) {
        int next = nextId();
        if (next != -1) {
            if (Q_UNLIKELY(d->history.contains(next))) {
                qWarning("QWizard::next: Page %d already met", next);
                return;
            }
            if (Q_UNLIKELY(!d->pageMap.contains(next))) {
                qWarning("QWizard::next: No such page %d", next);
                return;
            }
            d->switchToPage(next, QWizardPrivate::Forward);
        }
    }
}